

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

UnicodeString *
icu_63::number::impl::AffixUtils::escape(UnicodeString *__return_storage_ptr__,UnicodeString *input)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  uint srcChar;
  int32_t offset;
  ConstChar16Ptr local_48;
  char16_t *local_40;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003edbf0;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  offset = 0;
  bVar2 = false;
  do {
    sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (input->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 <= offset) {
      if (bVar2) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
      }
      return __return_storage_ptr__;
    }
    srcChar = UnicodeString::char32At(input,offset);
    switch(srcChar) {
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2c:
switchD_00260358_caseD_26:
      if (bVar2) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        bVar2 = false;
        UnicodeString::append(__return_storage_ptr__,srcChar);
        break;
      }
      goto LAB_00260395;
    case 0x27:
      local_48.p_ = L"\'\'";
      UnicodeString::append(__return_storage_ptr__,&local_48,-1);
      local_40 = local_48.p_;
      break;
    default:
      if ((srcChar != 0xa4) && (srcChar != 0x2030)) goto switchD_00260358_caseD_26;
    case 0x25:
    case 0x2b:
    case 0x2d:
      if (bVar2) {
LAB_00260395:
        UnicodeString::append(__return_storage_ptr__,srcChar);
      }
      else {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        UnicodeString::append(__return_storage_ptr__,srcChar);
        bVar2 = true;
      }
    }
    offset = (offset - (uint)(srcChar < 0x10000)) + 2;
  } while( true );
}

Assistant:

UnicodeString AffixUtils::escape(const UnicodeString &input) {
    AffixPatternState state = STATE_BASE;
    int32_t offset = 0;
    UnicodeString output;
    for (; offset < input.length();) {
        UChar32 cp = input.char32At(offset);

        switch (cp) {
            case u'\'':
                output.append(u"''", -1);
                break;

            case u'-':
            case u'+':
            case u'%':
            case u'‰':
            case u'¤':
                if (state == STATE_BASE) {
                    output.append(u'\'');
                    output.append(cp);
                    state = STATE_INSIDE_QUOTE;
                } else {
                    output.append(cp);
                }
                break;

            default:
                if (state == STATE_INSIDE_QUOTE) {
                    output.append(u'\'');
                    output.append(cp);
                    state = STATE_BASE;
                } else {
                    output.append(cp);
                }
                break;
        }
        offset += U16_LENGTH(cp);
    }

    if (state == STATE_INSIDE_QUOTE) {
        output.append(u'\'');
    }

    return output;
}